

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_RemoveChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int flags;
  int iVar1;
  AActor *pAVar2;
  PClassActor *filter;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  VMValue *pVVar6;
  VMValue *pVVar7;
  AActor *removetarget;
  AActor *pAVar8;
  char *pcVar9;
  bool bVar10;
  TThinkerIterator<AActor> it;
  FName local_4c;
  FThinkerIterator local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar2 = (AActor *)(param->field_0).field_1.a;
      if (pAVar2 != (AActor *)0x0) {
        if ((pAVar2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(pAVar2->super_DThinker).super_DObject._vptr_DObject)(pAVar2);
          (pAVar2->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar5 = (pAVar2->super_DThinker).super_DObject.Class;
        bVar10 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar10) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar10 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e027f;
        }
      }
      if (numparam == 1) {
        pVVar6 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e029e:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1880,
                        "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar6 = param;
        if (param[1].field_0.field_3.Type != '\0') {
          pcVar9 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003e029e;
        }
      }
      iVar4 = pVVar6[1].field_0.i;
      if (numparam < 3) {
        pVVar6 = defaultparam->Array;
        if (pVVar6[2].field_0.field_3.Type != '\0') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003e02bd;
        }
      }
      else {
        pVVar6 = param;
        if (param[2].field_0.field_3.Type != '\0') {
          pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003e02bd:
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1881,
                        "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      flags = pVVar6[2].field_0.i;
      if (numparam < 4) {
        pVVar6 = defaultparam->Array;
        if ((pVVar6[3].field_0.field_3.Type != '\x03') ||
           ((pVVar7 = pVVar6 + 3, pVVar6[3].field_0.field_1.atag != 1 &&
            ((pVVar7->field_0).field_1.a != (void *)0x0)))) {
          pcVar9 = 
          "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
          ;
          goto LAB_003e0260;
        }
      }
      else if ((param[3].field_0.field_3.Type != '\x03') ||
              ((pVVar7 = param + 3, param[3].field_0.field_1.atag != 1 &&
               ((pVVar7->field_0).field_1.a != (void *)0x0)))) {
        pcVar9 = 
        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
        ;
LAB_003e0260:
        __assert_fail(pcVar9,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1882,
                      "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      filter = (PClassActor *)(pVVar7->field_0).field_1.a;
      if (numparam < 5) {
        param = defaultparam->Array;
        if (param[4].field_0.field_3.Type == '\0') goto LAB_003e01a6;
        pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[4].field_0.field_3.Type == '\0') {
LAB_003e01a6:
          iVar1 = param[4].field_0.i;
          FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
          removetarget = (AActor *)FThinkerIterator::Next(&local_48,false);
          if (removetarget != (AActor *)0x0) {
            do {
              pAVar8 = (removetarget->master).field_0.p;
              if ((pAVar8 != (AActor *)0x0) &&
                 (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (removetarget->master).field_0.p = (AActor *)0x0;
                pAVar8 = (AActor *)0x0;
              }
              if ((pAVar8 == pAVar2) && ((removetarget->health < 1 || (iVar4 != 0)))) {
                local_4c.Index = iVar1;
                DoRemove(removetarget,flags,filter,&local_4c);
              }
              removetarget = (AActor *)FThinkerIterator::Next(&local_48,false);
            } while (removetarget != (AActor *)0x0);
          }
          return 0;
        }
        pcVar9 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1883,
                    "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e027f:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x187f,
                "int AF_AActor_A_RemoveChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveChildren)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(removeall);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ((mo = it.Next()) != NULL)
	{
		if (mo->master == self && (mo->health <= 0 || removeall))
		{
			DoRemove(mo, flags, filter, species);
		}
	}
	return 0;
}